

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::InnerProduct3D_1D::forward_impl
          (InnerProduct3D_1D *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  size_type sVar1;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> C;
  array<DimPair,_1> dims;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> b;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> A;
  TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
  *in_stack_fffffffffffffe48;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *in_stack_fffffffffffffe50;
  Tensor *in_stack_fffffffffffffe60;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> *in_stack_fffffffffffffe68;
  Tensor *in_stack_fffffffffffffe70;
  TensorBase<Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_0>
  *in_stack_fffffffffffffe78;
  undefined8 local_70;
  undefined8 local_68;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_60;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_28;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 *local_8;
  
  local_28 = in_RSI;
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
  Tensor::t<3>(in_stack_fffffffffffffe70);
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_28,1);
  local_60 = Tensor::t<1>(in_stack_fffffffffffffe60);
  local_8 = &local_70;
  local_10 = 2;
  local_18 = 0;
  local_70 = 2;
  local_68 = 0;
  sVar1 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size(local_28);
  if (sVar1 == 2) {
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,0>::
    contract<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,std::array<Eigen::IndexPair<long>,1ul>>
              ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_0>
                *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
               (array<Eigen::IndexPair<long>,_1UL> *)in_stack_fffffffffffffe60);
    Tensor::t<2>(in_stack_fffffffffffffe70);
    Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>::operator=
              (in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->m_lhs_xpr);
  }
  else {
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_28,2);
    Tensor::t<2>(in_stack_fffffffffffffe70);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,0>::
    contract<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,std::array<Eigen::IndexPair<long>,1ul>>
              ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_0>
                *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
               (array<Eigen::IndexPair<long>,_1UL> *)in_stack_fffffffffffffe60);
    Eigen::
    TensorBase<Eigen::TensorContractionOp<std::array<Eigen::IndexPair<long>,1ul>const,Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>const,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>const,Eigen::NoOpOutputKernel_const>,0>
    ::operator+(in_stack_fffffffffffffe78,
                (TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)
                in_stack_fffffffffffffe70);
    Tensor::t<2>(in_stack_fffffffffffffe70);
    Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>::operator=
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  }
  return;
}

Assistant:

void InnerProduct3D_1D::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  auto A = xs[0]->t<3>();
  auto b = xs[1]->t<1>();
  typedef Eigen::Tensor<float, 1>::DimensionPair DimPair;
  Eigen::array<DimPair, 1> dims({{DimPair(2, 0)}});
  if (xs.size() == 2) {
    fx.t<2>() = A.contract(b, dims);
  } else {
    auto C = xs[2]->t<2>();
    fx.t<2>() = A.contract(b, dims) + C;
  }
}